

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mplayer.cpp
# Opt level: O0

void __thiscall V2MPlayer::Reset(V2MPlayer *this)

{
  Channel *pCVar1;
  CC *pCVar2;
  CC *pCVar3;
  Channel *pCVar4;
  CC *scc;
  CC *bcc;
  int cn;
  Channel *sc;
  Channel *bc;
  int ch;
  V2MPlayer *this_local;
  
  (this->m_state).time = 0;
  (this->m_state).nexttime = 0xffffffff;
  (this->m_state).gptr = (this->m_base).gptr;
  (this->m_state).gnr = 0;
  if (((this->m_state).gnr < (this->m_base).gdnum) &&
     ((this->m_state).gnt =
           (this->m_state).time +
           (uint)*(this->m_state).gptr + (uint)(this->m_state).gptr[(this->m_base).gdnum] * 0x100 +
           (uint)(this->m_state).gptr[(this->m_base).gdnum << 1] * 0x10000,
     (this->m_state).gnt < (this->m_state).nexttime)) {
    (this->m_state).nexttime = (this->m_state).gnt;
  }
  for (bc._4_4_ = 0; bc._4_4_ < 0x10; bc._4_4_ = bc._4_4_ + 1) {
    pCVar4 = (this->m_base).chan + bc._4_4_;
    pCVar1 = (this->m_state).chan + bc._4_4_;
    if (pCVar4->notenum != 0) {
      pCVar1->noteptr = pCVar4->noteptr;
      pCVar1->lastvel = '\0';
      pCVar1->lastnte = '\0';
      pCVar1->notenr = 0;
      if ((pCVar1->notenr < pCVar4->notenum) &&
         (pCVar1->notent =
               (this->m_state).time +
               (uint)*pCVar1->noteptr + (uint)pCVar1->noteptr[pCVar4->notenum] * 0x100 +
               (uint)pCVar1->noteptr[pCVar4->notenum << 1] * 0x10000,
         pCVar1->notent < (this->m_state).nexttime)) {
        (this->m_state).nexttime = pCVar1->notent;
      }
      pCVar1->pcptr = pCVar4->pcptr;
      pCVar1->lastpc = '\0';
      pCVar1->pcnr = 0;
      if ((pCVar1->pcnr < pCVar4->pcnum) &&
         (pCVar1->pcnt = (this->m_state).time +
                         (uint)*pCVar1->pcptr + (uint)pCVar1->pcptr[pCVar4->pcnum] * 0x100 +
                         (uint)pCVar1->pcptr[pCVar4->pcnum << 1] * 0x10000,
         pCVar1->pcnt < (this->m_state).nexttime)) {
        (this->m_state).nexttime = pCVar1->pcnt;
      }
      pCVar1->pbptr = pCVar4->pbptr;
      pCVar1->lastpb1 = '\0';
      pCVar1->lastpb0 = '\0';
      pCVar1->pbnr = 0;
      if ((pCVar1->pbnr < pCVar4->pcnum) &&
         (pCVar1->pbnt = (this->m_state).time +
                         (uint)*pCVar1->pbptr + (uint)pCVar1->pbptr[pCVar4->pcnum] * 0x100 +
                         (uint)pCVar1->pbptr[pCVar4->pcnum << 1] * 0x10000,
         pCVar1->pbnt < (this->m_state).nexttime)) {
        (this->m_state).nexttime = pCVar1->pbnt;
      }
      for (bcc._4_4_ = 0; bcc._4_4_ < 7; bcc._4_4_ = bcc._4_4_ + 1) {
        pCVar2 = pCVar4->ctl + bcc._4_4_;
        pCVar3 = pCVar1->ctl + bcc._4_4_;
        pCVar3->ccptr = pCVar2->ccptr;
        pCVar3->lastcc = '\0';
        pCVar3->ccnr = 0;
        if ((pCVar3->ccnr < pCVar2->ccnum) &&
           (pCVar3->ccnt = (this->m_state).time +
                           (uint)*pCVar3->ccptr + (uint)pCVar3->ccptr[pCVar2->ccnum] * 0x100 +
                           (uint)pCVar3->ccptr[pCVar2->ccnum << 1] * 0x10000,
           pCVar3->ccnt < (this->m_state).nexttime)) {
          (this->m_state).nexttime = pCVar3->ccnt;
        }
      }
    }
  }
  (this->m_state).usecs = this->m_samplerate * 5000;
  (this->m_state).num = 4;
  (this->m_state).den = 4;
  (this->m_state).tpq = 8;
  (this->m_state).bar = 0;
  (this->m_state).beat = 0;
  (this->m_state).tick = 0;
  (this->m_state).smplrem = 0;
  (this->m_state).cursmpl = 0;
  if (this->m_samplerate != 0) {
    synthInit(this,(this->m_base).patchmap,this->m_samplerate);
    synthSetGlobals(this,(this->m_base).globals);
    synthSetLyrics(this,(this->m_base).speechptrs);
  }
  return;
}

Assistant:

void V2MPlayer::Reset()
{
    m_state.time = 0;
    m_state.nexttime = (uint32_t)-1;

    m_state.gptr = m_base.gptr;
    m_state.gnr  = 0;
    UPDATENT(m_state.gnr, m_state.gnt, m_state.gptr, m_base.gdnum);
    for (int ch = 0; ch < 16; ch++)
    {
        V2MBase::Channel &bc = m_base.chan[ch];
        PlayerState::Channel &sc = m_state.chan[ch];

        if (!bc.notenum)
            continue;
        sc.noteptr = bc.noteptr;
        sc.notenr  = sc.lastnte = sc.lastvel = 0;
        UPDATENT(sc.notenr,sc.notent, sc.noteptr, bc.notenum);
        sc.pcptr = bc.pcptr;
        sc.pcnr  = sc.lastpc=0;
        UPDATENT(sc.pcnr,sc.pcnt, sc.pcptr, bc.pcnum);
        sc.pbptr = bc.pbptr;
        sc.pbnr  = sc.lastpb0 = sc.lastpb1 = 0;
        UPDATENT(sc.pbnr,sc.pbnt, sc.pbptr, bc.pcnum);
        for (int cn = 0; cn < 7; cn++)
        {
            V2MBase::Channel::CC &bcc = bc.ctl[cn];
            PlayerState::Channel::CC &scc = sc.ctl[cn];
            scc.ccptr = bcc.ccptr;
            scc.ccnr  = scc.lastcc=0;
            UPDATENT(scc.ccnr, scc.ccnt, scc.ccptr, bcc.ccnum);
        }
    }
    m_state.usecs = 5000*m_samplerate;
    m_state.num   = 4;
    m_state.den   = 4;
    m_state.tpq   = 8;
    m_state.bar   = 0;
    m_state.beat  = 0;
    m_state.tick  = 0;
    m_state.smplrem = 0;
    m_state.cursmpl = 0;

    if (m_samplerate)
    {
        synthInit(m_synth, (void*)m_base.patchmap, m_samplerate);
        synthSetGlobals(m_synth, (void*)m_base.globals);
        synthSetLyrics(m_synth, m_base.speechptrs);
    }
}